

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

int Wlc_NtkCreateLevels_(Wlc_Ntk_t *p)

{
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar1;
  Wlc_Obj_t *pWVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar10;
  int iVar11;
  
  uVar3 = p->iObj;
  if ((p->vLevels).nCap < (int)uVar3) {
    piVar5 = (p->vLevels).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar3 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar3 << 2);
    }
    (p->vLevels).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vLevels).nCap = uVar3;
  }
  if (0 < (int)uVar3) {
    memset((p->vLevels).pArray,0,(ulong)uVar3 * 4);
  }
  (p->vLevels).nSize = uVar3;
  iVar4 = 0;
  if (1 < p->iObj) {
    iVar4 = 0;
    lVar6 = 1;
    do {
      if (p->nObjsAlloc <= lVar6) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      uVar3 = p->pObjs[lVar6].nFanins;
      if ((long)(int)uVar3 < 1) {
        iVar9 = (p->vLevels).nSize;
        iVar7 = 0;
      }
      else {
        pWVar2 = p->pObjs + lVar6;
        paVar1 = &pWVar2->field_10;
        lVar8 = 0;
        iVar7 = 0;
        do {
          if ((2 < uVar3) || (paVar10 = paVar1, (*(uint *)pWVar2 & 0x3f | 0x10) == 0x16)) {
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar1->pFanins[0];
          }
          iVar11 = paVar10->Fanins[lVar8];
          if (((long)iVar11 < 0) || (iVar9 = (p->vLevels).nSize, iVar9 <= iVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar11 = (p->vLevels).pArray[iVar11] + 1;
          if (iVar7 <= iVar11) {
            iVar7 = iVar11;
          }
          lVar8 = lVar8 + 1;
        } while ((int)uVar3 != lVar8);
      }
      if (iVar9 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      if (iVar4 <= iVar7) {
        iVar4 = iVar7;
      }
      (p->vLevels).pArray[lVar6] = iVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->iObj);
  }
  return iVar4;
}

Assistant:

int Wlc_NtkCreateLevels_( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, Level, LevelMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        Level = 0;
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Level = Abc_MaxInt( Level, Wlc_ObjLevelId(p, iFanin) + 1 );
        Vec_IntWriteEntry( &p->vLevels, i, Level );
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    return LevelMax;
}